

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * __thiscall
leveldb::NumberToString_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,uint64_t num)

{
  uint64_t num_local;
  string *r;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  AppendNumberTo(__return_storage_ptr__,(uint64_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::string NumberToString(uint64_t num) {
  std::string r;
  AppendNumberTo(&r, num);
  return r;
}